

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_start_struct(flatcc_builder_t *B,size_t size,uint16_t align)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = enter_frame(B,align);
  if (iVar1 != 0) {
    return (void *)0x0;
  }
  B->frame->type = 2;
  refresh_ds(B,0xfffffffc);
  pvVar2 = push_ds(B,(flatbuffers_uoffset_t)size);
  return pvVar2;
}

Assistant:

void *flatcc_builder_start_struct(flatcc_builder_t *B, size_t size, uint16_t align)
{
    /* Allocate space for the struct on the ds stack. */
    if (enter_frame(B, align)) {
        return 0;
    }
    frame(type) = flatcc_builder_struct;
    refresh_ds(B, data_limit);
    return push_ds(B, (uoffset_t)size);
}